

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

Aig_Man_t * Dar_ManBalanceXor(Aig_Man_t *pAig,int fExor,int fUpdateLevel,int fVerbose)

{
  Aig_Man_t *p;
  undefined8 local_30;
  Aig_Man_t *pRes;
  Aig_Man_t *pAigXor;
  int fVerbose_local;
  int fUpdateLevel_local;
  int fExor_local;
  Aig_Man_t *pAig_local;
  
  if (fExor == 0) {
    local_30 = Dar_ManBalance(pAig,fUpdateLevel);
  }
  else {
    p = Aig_ManDupExor(pAig);
    if (fVerbose != 0) {
      Dar_BalancePrintStats(p);
    }
    local_30 = Dar_ManBalance(p,fUpdateLevel);
    Aig_ManStop(p);
  }
  return local_30;
}

Assistant:

Aig_Man_t * Dar_ManBalanceXor( Aig_Man_t * pAig, int fExor, int fUpdateLevel, int fVerbose )
{
    Aig_Man_t * pAigXor, * pRes;
    if ( fExor )
    {
        pAigXor = Aig_ManDupExor( pAig );
        if ( fVerbose )
            Dar_BalancePrintStats( pAigXor );
        pRes = Dar_ManBalance( pAigXor, fUpdateLevel );
        Aig_ManStop( pAigXor );
    }
    else
    {
        pRes = Dar_ManBalance( pAig, fUpdateLevel );
    }
    return pRes;
}